

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall
slang::ast::Scope::handleExportedMethods
          (Scope *this,span<slang::ast::Symbol_*const,_18446744073709551615UL> deferredMembers)

{
  char *pcVar1;
  int *piVar2;
  AnsiPortListSyntax *pAVar3;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  group_type_pointer pgVar8;
  value_type_pointer pbVar9;
  group_type_pointer pgVar10;
  value_type_pointer ppVar11;
  ulong uVar12;
  bool bVar13;
  byte bVar14;
  uint uVar15;
  ModportItemSyntax *pMVar16;
  MemberSyntax *pMVar17;
  ModportSubroutinePortSyntax *syntax;
  uint64_t uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  pointer ppSVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  char cVar30;
  char cVar31;
  char cVar32;
  byte bVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  byte bVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  byte bVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  byte bVar45;
  string_view name;
  iterator __begin5;
  iterator __begin4;
  const_iterator __begin3;
  anon_class_8_1_8991fb9c create;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  waitingForImport;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  foundImports;
  try_emplace_args_t local_299;
  ulong local_298;
  undefined2 local_28a;
  string_view local_288;
  char local_278;
  char cStack_277;
  char cStack_276;
  byte bStack_275;
  char cStack_274;
  char cStack_273;
  char cStack_272;
  byte bStack_271;
  char cStack_270;
  char cStack_26f;
  char cStack_26e;
  byte bStack_26d;
  char cStack_26c;
  char cStack_26b;
  char cStack_26a;
  byte bStack_269;
  ulong local_260;
  Scope *local_258;
  ModportSubroutinePortSyntax *local_250;
  iterator_base<slang::syntax::ModportPortSyntax_*> local_248;
  iterator_base<slang::syntax::MemberSyntax_*> local_238;
  iterator_base<const_slang::syntax::ModportItemSyntax_*> local_228;
  anon_class_8_1_8991fb9c local_218;
  locator local_210;
  pointer local_1f8;
  pointer local_1f0;
  ulong local_1e8;
  ParentList *local_1e0;
  ulong local_1d8;
  ParentList *local_1d0;
  ulong local_1c8;
  ParentList *local_1c0;
  undefined1 local_1b8 [72];
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  local_170;
  char local_138;
  char cStack_137;
  char cStack_136;
  byte bStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  byte bStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  byte bStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  byte bStack_129;
  char local_128;
  char cStack_127;
  char cStack_126;
  byte bStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  byte bStack_121;
  char cStack_120;
  char cStack_11f;
  char cStack_11e;
  byte bStack_11d;
  char cStack_11c;
  char cStack_11b;
  char cStack_11a;
  byte bStack_119;
  char local_118;
  char cStack_117;
  char cStack_116;
  byte bStack_115;
  char cStack_114;
  char cStack_113;
  char cStack_112;
  byte bStack_111;
  char cStack_110;
  char cStack_10f;
  char cStack_10e;
  byte bStack_10d;
  char cStack_10c;
  char cStack_10b;
  char cStack_10a;
  byte bStack_109;
  char local_108;
  char cStack_107;
  char cStack_106;
  byte bStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  byte bStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  byte bStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  byte bStack_f9;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  byte bStack_f5;
  char cStack_f4;
  char cStack_f3;
  char cStack_f2;
  byte bStack_f1;
  char cStack_f0;
  char cStack_ef;
  char cStack_ee;
  byte bStack_ed;
  char cStack_ec;
  char cStack_eb;
  char cStack_ea;
  byte bStack_e9;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  byte bStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  byte bStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  byte bStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  byte bStack_d9;
  undefined1 local_d8 [104];
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  local_70;
  
  ppSVar22 = deferredMembers._M_ptr;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
              *)local_1b8);
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
              *)local_d8);
  local_1f0 = ppSVar22 + deferredMembers._M_extent._M_extent_value._M_extent_value;
  local_258 = this;
  local_218.this = this;
  do {
    if (ppSVar22 == local_1f0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
                     *)(local_d8 + 0x68));
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
                     *)(local_1b8 + 0x48));
      return;
    }
    piVar2 = *(int **)(*ppSVar22 + 1);
    if (*piVar2 == 0x12d) {
      local_228.list = (ParentList *)(piVar2 + 0x18);
      local_228.index = 0;
      local_1e8 = *(long *)(piVar2 + 0x24) + 1U >> 1;
      local_1f8 = ppSVar22;
      local_1e0 = local_228.list;
      for (; (local_228.list != local_1e0 || (ppSVar22 = local_1f8, local_228.index != local_1e8));
          local_228.index = local_228.index + 1) {
        pMVar16 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::
                  iterator_base<const_slang::syntax::ModportItemSyntax_*>::dereference(&local_228);
        pAVar3 = (pMVar16->ports).ptr;
        local_238.list = &pAVar3->ports;
        local_238.index = 0;
        local_1d8 = (pAVar3->ports).elements._M_extent._M_extent_value + 1 >> 1;
        local_1d0 = local_238.list;
        for (; (local_238.list != local_1d0 || (local_238.index != local_1d8));
            local_238.index = local_238.index + 1) {
          pMVar17 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::
                    iterator_base<slang::syntax::MemberSyntax_*>::dereference(&local_238);
          if ((pMVar17->super_SyntaxNode).kind == ModportSubroutinePortList) {
            local_28a = (undefined2)pMVar17[1].super_SyntaxNode.kind;
            local_248.list = (ParentList *)&pMVar17[1].super_SyntaxNode.previewNode;
            local_248.index = 0;
            local_1c8 = (long)pMVar17[1].attributes.
                              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                              ._M_ptr + 1U >> 1;
            local_1c0 = local_248.list;
            for (; (local_248.list != local_1c0 || (local_248.index != local_1c8));
                local_248.index = local_248.index + 1) {
              syntax = (ModportSubroutinePortSyntax *)
                       slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                       iterator_base<slang::syntax::ModportPortSyntax_*>::dereference(&local_248);
              if ((syntax->super_ModportPortSyntax).super_SyntaxNode.kind == ModportNamedPort) {
                if ((local_28a == ElementSelect) &&
                   (local_288 = parsing::Token::valueText((Token *)&syntax->prototype),
                   local_288._M_len != 0)) {
                  phVar4 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                           local_258->nameMap;
                  uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                           operator()(phVar4,&local_288);
                  uVar20 = uVar18 >> ((byte)*phVar4 & 0x3f);
                  lVar21 = (uVar18 & 0xff) * 4;
                  cVar30 = (&UNK_0042856c)[lVar21];
                  cVar31 = (&UNK_0042856d)[lVar21];
                  cVar32 = (&UNK_0042856e)[lVar21];
                  bVar33 = (&UNK_0042856f)[lVar21];
                  uVar19 = 0;
                  cVar34 = cVar30;
                  cVar35 = cVar31;
                  cVar36 = cVar32;
                  bVar37 = bVar33;
                  cVar38 = cVar30;
                  cVar39 = cVar31;
                  cVar40 = cVar32;
                  bVar41 = bVar33;
                  cVar42 = cVar30;
                  cVar43 = cVar31;
                  cVar44 = cVar32;
                  bVar45 = bVar33;
                  do {
                    lVar21 = *(long *)(phVar4 + 0x10);
                    pcVar1 = (char *)(lVar21 + uVar20 * 0x10);
                    local_118 = *pcVar1;
                    cStack_117 = pcVar1[1];
                    cStack_116 = pcVar1[2];
                    bStack_115 = pcVar1[3];
                    cStack_114 = pcVar1[4];
                    cStack_113 = pcVar1[5];
                    cStack_112 = pcVar1[6];
                    bStack_111 = pcVar1[7];
                    cStack_110 = pcVar1[8];
                    cStack_10f = pcVar1[9];
                    cStack_10e = pcVar1[10];
                    bStack_10d = pcVar1[0xb];
                    cStack_10c = pcVar1[0xc];
                    cStack_10b = pcVar1[0xd];
                    cStack_10a = pcVar1[0xe];
                    bVar14 = pcVar1[0xf];
                    auVar24[0] = -(local_118 == cVar30);
                    auVar24[1] = -(cStack_117 == cVar31);
                    auVar24[2] = -(cStack_116 == cVar32);
                    auVar24[3] = -(bStack_115 == bVar33);
                    auVar24[4] = -(cStack_114 == cVar34);
                    auVar24[5] = -(cStack_113 == cVar35);
                    auVar24[6] = -(cStack_112 == cVar36);
                    auVar24[7] = -(bStack_111 == bVar37);
                    auVar24[8] = -(cStack_110 == cVar38);
                    auVar24[9] = -(cStack_10f == cVar39);
                    auVar24[10] = -(cStack_10e == cVar40);
                    auVar24[0xb] = -(bStack_10d == bVar41);
                    auVar24[0xc] = -(cStack_10c == cVar42);
                    auVar24[0xd] = -(cStack_10b == cVar43);
                    auVar24[0xe] = -(cStack_10a == cVar44);
                    auVar24[0xf] = -(bVar14 == bVar45);
                    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
                    bStack_109 = bVar14;
                    if (uVar15 != 0) {
                      lVar5 = *(long *)(phVar4 + 0x18);
                      local_298 = uVar19;
                      local_278 = cVar30;
                      cStack_277 = cVar31;
                      cStack_276 = cVar32;
                      bStack_275 = bVar33;
                      cStack_274 = cVar34;
                      cStack_273 = cVar35;
                      cStack_272 = cVar36;
                      bStack_271 = bVar37;
                      cStack_270 = cVar38;
                      cStack_26f = cVar39;
                      cStack_26e = cVar40;
                      bStack_26d = bVar41;
                      cStack_26c = cVar42;
                      cStack_26b = cVar43;
                      cStack_26a = cVar44;
                      bStack_269 = bVar45;
                      do {
                        uVar6 = 0;
                        if (uVar15 != 0) {
                          for (; (uVar15 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                          }
                        }
                        bVar13 = std::
                                 equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                 operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)phVar4,&local_288,
                                            (basic_string_view<char,_std::char_traits<char>_> *)
                                            ((ulong)uVar6 * 0x18 + lVar5 + uVar20 * 0x168));
                        if (bVar13) goto LAB_002f2507;
                        uVar15 = uVar15 - 1 & uVar15;
                      } while (uVar15 != 0);
                      bVar14 = *(byte *)(lVar21 + uVar20 * 0x10 + 0xf);
                      uVar19 = local_298;
                      cVar30 = local_278;
                      cVar31 = cStack_277;
                      cVar32 = cStack_276;
                      bVar33 = bStack_275;
                      cVar34 = cStack_274;
                      cVar35 = cStack_273;
                      cVar36 = cStack_272;
                      bVar37 = bStack_271;
                      cVar38 = cStack_270;
                      cVar39 = cStack_26f;
                      cVar40 = cStack_26e;
                      bVar41 = bStack_26d;
                      cVar42 = cStack_26c;
                      cVar43 = cStack_26b;
                      cVar44 = cStack_26a;
                      bVar45 = bStack_269;
                    }
                    if (((&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar14) == 0
                       ) break;
                    lVar21 = uVar20 + uVar19;
                    uVar19 = uVar19 + 1;
                    uVar20 = lVar21 + 1U & *(ulong *)(phVar4 + 8);
                  } while (uVar19 <= *(ulong *)(phVar4 + 8));
                  uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                           operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                       *)(local_d8 + 0x68),&local_288);
                  uVar20 = uVar18 >> ((byte)local_70.arrays.groups_size_index & 0x3f);
                  lVar21 = (uVar18 & 0xff) * 4;
                  cVar30 = (&UNK_0042856c)[lVar21];
                  cVar31 = (&UNK_0042856d)[lVar21];
                  cVar32 = (&UNK_0042856e)[lVar21];
                  bVar33 = (&UNK_0042856f)[lVar21];
                  uVar19 = 0;
                  cVar34 = cVar30;
                  cVar35 = cVar31;
                  cVar36 = cVar32;
                  bVar37 = bVar33;
                  cVar38 = cVar30;
                  cVar39 = cVar31;
                  cVar40 = cVar32;
                  bVar41 = bVar33;
                  cVar42 = cVar30;
                  cVar43 = cVar31;
                  cVar44 = cVar32;
                  bVar45 = bVar33;
                  do {
                    ppVar11 = local_70.arrays.elements_;
                    pgVar10 = local_70.arrays.groups_;
                    pcVar1 = (char *)((long)local_70.arrays.groups_ + uVar20 * 0x10);
                    local_128 = *pcVar1;
                    cStack_127 = pcVar1[1];
                    cStack_126 = pcVar1[2];
                    bStack_125 = pcVar1[3];
                    cStack_124 = pcVar1[4];
                    cStack_123 = pcVar1[5];
                    cStack_122 = pcVar1[6];
                    bStack_121 = pcVar1[7];
                    cStack_120 = pcVar1[8];
                    cStack_11f = pcVar1[9];
                    cStack_11e = pcVar1[10];
                    bStack_11d = pcVar1[0xb];
                    cStack_11c = pcVar1[0xc];
                    cStack_11b = pcVar1[0xd];
                    cStack_11a = pcVar1[0xe];
                    bVar14 = pcVar1[0xf];
                    auVar25[0] = -(local_128 == cVar30);
                    auVar25[1] = -(cStack_127 == cVar31);
                    auVar25[2] = -(cStack_126 == cVar32);
                    auVar25[3] = -(bStack_125 == bVar33);
                    auVar25[4] = -(cStack_124 == cVar34);
                    auVar25[5] = -(cStack_123 == cVar35);
                    auVar25[6] = -(cStack_122 == cVar36);
                    auVar25[7] = -(bStack_121 == bVar37);
                    auVar25[8] = -(cStack_120 == cVar38);
                    auVar25[9] = -(cStack_11f == cVar39);
                    auVar25[10] = -(cStack_11e == cVar40);
                    auVar25[0xb] = -(bStack_11d == bVar41);
                    auVar25[0xc] = -(cStack_11c == cVar42);
                    auVar25[0xd] = -(cStack_11b == cVar43);
                    auVar25[0xe] = -(cStack_11a == cVar44);
                    auVar25[0xf] = -(bVar14 == bVar45);
                    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
                    bStack_119 = bVar14;
                    if (uVar15 != 0) {
                      do {
                        bStack_269 = bVar45;
                        cStack_26a = cVar44;
                        cStack_26b = cVar43;
                        cStack_26c = cVar42;
                        bStack_26d = bVar41;
                        cStack_26e = cVar40;
                        cStack_26f = cVar39;
                        cStack_270 = cVar38;
                        bStack_271 = bVar37;
                        cStack_272 = cVar36;
                        cStack_273 = cVar35;
                        cStack_274 = cVar34;
                        bStack_275 = bVar33;
                        cStack_276 = cVar32;
                        cStack_277 = cVar31;
                        local_278 = cVar30;
                        local_298 = uVar19;
                        uVar6 = 0;
                        if (uVar15 != 0) {
                          for (; (uVar15 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                          }
                        }
                        __y = (basic_string_view<char,_std::char_traits<char>_> *)
                              ((long)ppVar11 + (uVar20 * 0xf + (ulong)uVar6) * 0x18);
                        bVar13 = std::
                                 equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                 operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)(local_d8 + 0x68),&local_288,__y);
                        if (bVar13) {
                          handleExportedMethods::anon_class_8_1_8991fb9c::operator()
                                    (&local_218,(ModportSubroutinePortSyntax *)__y[1]._M_len);
                          goto LAB_002f2507;
                        }
                        uVar15 = uVar15 - 1 & uVar15;
                        uVar19 = local_298;
                        cVar30 = local_278;
                        cVar31 = cStack_277;
                        cVar32 = cStack_276;
                        bVar33 = bStack_275;
                        cVar34 = cStack_274;
                        cVar35 = cStack_273;
                        cVar36 = cStack_272;
                        bVar37 = bStack_271;
                        cVar38 = cStack_270;
                        cVar39 = cStack_26f;
                        cVar40 = cStack_26e;
                        bVar41 = bStack_26d;
                        cVar42 = cStack_26c;
                        cVar43 = cStack_26b;
                        cVar44 = cStack_26a;
                        bVar45 = bStack_269;
                      } while (uVar15 != 0);
                      bVar14 = *(byte *)((long)pgVar10 + uVar20 * 0x10 + 0xf);
                    }
                    if (((&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar14) == 0
                       ) break;
                    lVar21 = uVar20 + uVar19;
                    uVar19 = uVar19 + 1;
                    uVar20 = lVar21 + 1U & local_70.arrays.groups_size_mask;
                  } while (uVar19 <= local_70.arrays.groups_size_mask);
                  uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                           operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                       *)(local_1b8 + 0x48),&local_288);
                  uVar23 = uVar18 >> ((byte)local_170.arrays.groups_size_index & 0x3f);
                  lVar21 = (uVar18 & 0xff) * 4;
                  cVar30 = (&UNK_0042856c)[lVar21];
                  cVar31 = (&UNK_0042856d)[lVar21];
                  cVar32 = (&UNK_0042856e)[lVar21];
                  bVar33 = (&UNK_0042856f)[lVar21];
                  uVar20 = 0;
                  uVar19 = uVar23;
                  cVar34 = cVar30;
                  cVar35 = cVar31;
                  cVar36 = cVar32;
                  bVar37 = bVar33;
                  cVar38 = cVar30;
                  cVar39 = cVar31;
                  cVar40 = cVar32;
                  bVar41 = bVar33;
                  cVar42 = cVar30;
                  cVar43 = cVar31;
                  cVar44 = cVar32;
                  bVar45 = bVar33;
                  do {
                    pbVar9 = local_170.arrays.elements_;
                    pgVar8 = local_170.arrays.groups_;
                    pcVar1 = (char *)((long)local_170.arrays.groups_ + uVar19 * 0x10);
                    local_138 = *pcVar1;
                    cStack_137 = pcVar1[1];
                    cStack_136 = pcVar1[2];
                    bStack_135 = pcVar1[3];
                    cStack_134 = pcVar1[4];
                    cStack_133 = pcVar1[5];
                    cStack_132 = pcVar1[6];
                    bStack_131 = pcVar1[7];
                    cStack_130 = pcVar1[8];
                    cStack_12f = pcVar1[9];
                    cStack_12e = pcVar1[10];
                    bStack_12d = pcVar1[0xb];
                    cStack_12c = pcVar1[0xc];
                    cStack_12b = pcVar1[0xd];
                    cStack_12a = pcVar1[0xe];
                    bVar14 = pcVar1[0xf];
                    auVar26[0] = -(local_138 == cVar30);
                    auVar26[1] = -(cStack_137 == cVar31);
                    auVar26[2] = -(cStack_136 == cVar32);
                    auVar26[3] = -(bStack_135 == bVar33);
                    auVar26[4] = -(cStack_134 == cVar34);
                    auVar26[5] = -(cStack_133 == cVar35);
                    auVar26[6] = -(cStack_132 == cVar36);
                    auVar26[7] = -(bStack_131 == bVar37);
                    auVar26[8] = -(cStack_130 == cVar38);
                    auVar26[9] = -(cStack_12f == cVar39);
                    auVar26[10] = -(cStack_12e == cVar40);
                    auVar26[0xb] = -(bStack_12d == bVar41);
                    auVar26[0xc] = -(cStack_12c == cVar42);
                    auVar26[0xd] = -(cStack_12b == cVar43);
                    auVar26[0xe] = -(cStack_12a == cVar44);
                    auVar26[0xf] = -(bVar14 == bVar45);
                    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
                    uVar12 = uVar19;
                    bStack_129 = bVar14;
                    if (uVar15 != 0) {
                      do {
                        local_260 = uVar12;
                        bStack_269 = bVar45;
                        cStack_26a = cVar44;
                        cStack_26b = cVar43;
                        cStack_26c = cVar42;
                        bStack_26d = bVar41;
                        cStack_26e = cVar40;
                        cStack_26f = cVar39;
                        cStack_270 = cVar38;
                        bStack_271 = bVar37;
                        cStack_272 = cVar36;
                        cStack_273 = cVar35;
                        cStack_274 = cVar34;
                        bStack_275 = bVar33;
                        cStack_276 = cVar32;
                        cStack_277 = cVar31;
                        local_278 = cVar30;
                        local_298 = uVar20;
                        iVar7 = 0;
                        if (uVar15 != 0) {
                          for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                          }
                        }
                        bVar13 = std::
                                 equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                 operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)(local_1b8 + 0x48),&local_288,
                                            (basic_string_view<char,_std::char_traits<char>_> *)
                                            ((long)pbVar9 + uVar19 * 0xf0 +
                                            (ulong)(uint)(iVar7 << 4)));
                        if (bVar13) goto LAB_002f2507;
                        uVar15 = uVar15 - 1 & uVar15;
                        uVar20 = local_298;
                        cVar30 = local_278;
                        cVar31 = cStack_277;
                        cVar32 = cStack_276;
                        bVar33 = bStack_275;
                        cVar34 = cStack_274;
                        cVar35 = cStack_273;
                        cVar36 = cStack_272;
                        bVar37 = bStack_271;
                        cVar38 = cStack_270;
                        cVar39 = cStack_26f;
                        cVar40 = cStack_26e;
                        bVar41 = bStack_26d;
                        cVar42 = cStack_26c;
                        cVar43 = cStack_26b;
                        cVar44 = cStack_26a;
                        bVar45 = bStack_269;
                        uVar12 = local_260;
                      } while (uVar15 != 0);
                      bVar14 = *(byte *)((long)pgVar8 + uVar19 * 0x10 + 0xf);
                      uVar19 = local_260;
                    }
                    if (((&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar14) == 0
                       ) break;
                    lVar21 = uVar19 + uVar20;
                    uVar20 = uVar20 + 1;
                    uVar19 = lVar21 + 1U & local_170.arrays.groups_size_mask;
                  } while (uVar20 <= local_170.arrays.groups_size_mask);
                  if (local_170.size_ctrl.size < local_170.size_ctrl.ml) {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                    ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                              ((locator *)&local_210,
                               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                *)(local_1b8 + 0x48),uVar23,uVar18,&local_288);
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                    ::
                    unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                              ((locator *)&local_210,
                               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                *)(local_1b8 + 0x48),uVar18,&local_288);
                  }
                }
              }
              else {
                local_210._0_16_ =
                     slang::syntax::SyntaxNode::getLastToken
                               ((SyntaxNode *)(((syntax->prototype).ptr)->name).ptr);
                local_288 = parsing::Token::valueText((Token *)&local_210);
                if (local_288._M_len != 0) {
                  phVar4 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                           local_258->nameMap;
                  uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                           operator()(phVar4,&local_288);
                  uVar20 = uVar18 >> ((byte)*phVar4 & 0x3f);
                  lVar21 = (uVar18 & 0xff) * 4;
                  cVar30 = (&UNK_0042856c)[lVar21];
                  cVar31 = (&UNK_0042856d)[lVar21];
                  cVar32 = (&UNK_0042856e)[lVar21];
                  bVar33 = (&UNK_0042856f)[lVar21];
                  uVar19 = 0;
                  cVar34 = cVar30;
                  cVar35 = cVar31;
                  cVar36 = cVar32;
                  bVar37 = bVar33;
                  cVar38 = cVar30;
                  cVar39 = cVar31;
                  cVar40 = cVar32;
                  bVar41 = bVar33;
                  cVar42 = cVar30;
                  cVar43 = cVar31;
                  cVar44 = cVar32;
                  bVar45 = bVar33;
                  do {
                    lVar21 = *(long *)(phVar4 + 0x10);
                    pcVar1 = (char *)(lVar21 + uVar20 * 0x10);
                    local_e8 = *pcVar1;
                    cStack_e7 = pcVar1[1];
                    cStack_e6 = pcVar1[2];
                    bStack_e5 = pcVar1[3];
                    cStack_e4 = pcVar1[4];
                    cStack_e3 = pcVar1[5];
                    cStack_e2 = pcVar1[6];
                    bStack_e1 = pcVar1[7];
                    cStack_e0 = pcVar1[8];
                    cStack_df = pcVar1[9];
                    cStack_de = pcVar1[10];
                    bStack_dd = pcVar1[0xb];
                    cStack_dc = pcVar1[0xc];
                    cStack_db = pcVar1[0xd];
                    cStack_da = pcVar1[0xe];
                    bVar14 = pcVar1[0xf];
                    auVar27[0] = -(local_e8 == cVar30);
                    auVar27[1] = -(cStack_e7 == cVar31);
                    auVar27[2] = -(cStack_e6 == cVar32);
                    auVar27[3] = -(bStack_e5 == bVar33);
                    auVar27[4] = -(cStack_e4 == cVar34);
                    auVar27[5] = -(cStack_e3 == cVar35);
                    auVar27[6] = -(cStack_e2 == cVar36);
                    auVar27[7] = -(bStack_e1 == bVar37);
                    auVar27[8] = -(cStack_e0 == cVar38);
                    auVar27[9] = -(cStack_df == cVar39);
                    auVar27[10] = -(cStack_de == cVar40);
                    auVar27[0xb] = -(bStack_dd == bVar41);
                    auVar27[0xc] = -(cStack_dc == cVar42);
                    auVar27[0xd] = -(cStack_db == cVar43);
                    auVar27[0xe] = -(cStack_da == cVar44);
                    auVar27[0xf] = -(bVar14 == bVar45);
                    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
                    bStack_d9 = bVar14;
                    if (uVar15 != 0) {
                      lVar5 = *(long *)(phVar4 + 0x18);
                      local_298 = uVar19;
                      local_278 = cVar30;
                      cStack_277 = cVar31;
                      cStack_276 = cVar32;
                      bStack_275 = bVar33;
                      cStack_274 = cVar34;
                      cStack_273 = cVar35;
                      cStack_272 = cVar36;
                      bStack_271 = bVar37;
                      cStack_270 = cVar38;
                      cStack_26f = cVar39;
                      cStack_26e = cVar40;
                      bStack_26d = bVar41;
                      cStack_26c = cVar42;
                      cStack_26b = cVar43;
                      cStack_26a = cVar44;
                      bStack_269 = bVar45;
                      local_260 = uVar20;
                      do {
                        uVar6 = 0;
                        if (uVar15 != 0) {
                          for (; (uVar15 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                          }
                        }
                        bVar13 = std::
                                 equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                 operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)phVar4,&local_288,
                                            (basic_string_view<char,_std::char_traits<char>_> *)
                                            ((ulong)uVar6 * 0x18 + lVar5 + uVar20 * 0x168));
                        if (bVar13) goto LAB_002f2507;
                        uVar15 = uVar15 - 1 & uVar15;
                      } while (uVar15 != 0);
                      bVar14 = *(byte *)(lVar21 + uVar20 * 0x10 + 0xf);
                      uVar19 = local_298;
                      uVar20 = local_260;
                      cVar30 = local_278;
                      cVar31 = cStack_277;
                      cVar32 = cStack_276;
                      bVar33 = bStack_275;
                      cVar34 = cStack_274;
                      cVar35 = cStack_273;
                      cVar36 = cStack_272;
                      bVar37 = bStack_271;
                      cVar38 = cStack_270;
                      cVar39 = cStack_26f;
                      cVar40 = cStack_26e;
                      bVar41 = bStack_26d;
                      cVar42 = cStack_26c;
                      cVar43 = cStack_26b;
                      cVar44 = cStack_26a;
                      bVar45 = bStack_269;
                    }
                    if (((&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar14) == 0
                       ) break;
                    lVar21 = uVar20 + uVar19;
                    uVar19 = uVar19 + 1;
                    uVar20 = lVar21 + 1U & *(ulong *)(phVar4 + 8);
                  } while (uVar19 <= *(ulong *)(phVar4 + 8));
                  if (local_28a == ElementSelect) {
LAB_002f2285:
                    handleExportedMethods::anon_class_8_1_8991fb9c::operator()(&local_218,syntax);
                  }
                  else {
                    uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                             operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                         *)(local_1b8 + 0x48),&local_288);
                    uVar20 = uVar18 >> ((byte)local_170.arrays.groups_size_index & 0x3f);
                    lVar21 = (uVar18 & 0xff) * 4;
                    cVar30 = (&UNK_0042856c)[lVar21];
                    cVar31 = (&UNK_0042856d)[lVar21];
                    cVar32 = (&UNK_0042856e)[lVar21];
                    bVar33 = (&UNK_0042856f)[lVar21];
                    uVar19 = 0;
                    cVar34 = cVar30;
                    cVar35 = cVar31;
                    cVar36 = cVar32;
                    bVar37 = bVar33;
                    cVar38 = cVar30;
                    cVar39 = cVar31;
                    cVar40 = cVar32;
                    bVar41 = bVar33;
                    cVar42 = cVar30;
                    cVar43 = cVar31;
                    cVar44 = cVar32;
                    bVar45 = bVar33;
                    do {
                      pbVar9 = local_170.arrays.elements_;
                      pgVar8 = local_170.arrays.groups_;
                      pcVar1 = (char *)((long)local_170.arrays.groups_ + uVar20 * 0x10);
                      local_f8 = *pcVar1;
                      cStack_f7 = pcVar1[1];
                      cStack_f6 = pcVar1[2];
                      bStack_f5 = pcVar1[3];
                      cStack_f4 = pcVar1[4];
                      cStack_f3 = pcVar1[5];
                      cStack_f2 = pcVar1[6];
                      bStack_f1 = pcVar1[7];
                      cStack_f0 = pcVar1[8];
                      cStack_ef = pcVar1[9];
                      cStack_ee = pcVar1[10];
                      bStack_ed = pcVar1[0xb];
                      cStack_ec = pcVar1[0xc];
                      cStack_eb = pcVar1[0xd];
                      cStack_ea = pcVar1[0xe];
                      bVar14 = pcVar1[0xf];
                      auVar28[0] = -(local_f8 == cVar30);
                      auVar28[1] = -(cStack_f7 == cVar31);
                      auVar28[2] = -(cStack_f6 == cVar32);
                      auVar28[3] = -(bStack_f5 == bVar33);
                      auVar28[4] = -(cStack_f4 == cVar34);
                      auVar28[5] = -(cStack_f3 == cVar35);
                      auVar28[6] = -(cStack_f2 == cVar36);
                      auVar28[7] = -(bStack_f1 == bVar37);
                      auVar28[8] = -(cStack_f0 == cVar38);
                      auVar28[9] = -(cStack_ef == cVar39);
                      auVar28[10] = -(cStack_ee == cVar40);
                      auVar28[0xb] = -(bStack_ed == bVar41);
                      auVar28[0xc] = -(cStack_ec == cVar42);
                      auVar28[0xd] = -(cStack_eb == cVar43);
                      auVar28[0xe] = -(cStack_ea == cVar44);
                      auVar28[0xf] = -(bVar14 == bVar45);
                      uVar15 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                              (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                              (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                              (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                              (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                              (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                              (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                              (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                              (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                              (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                              (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                              (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                              (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                              (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                             (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
                      bStack_e9 = bVar14;
                      if (uVar15 != 0) {
                        do {
                          bStack_269 = bVar45;
                          cStack_26a = cVar44;
                          cStack_26b = cVar43;
                          cStack_26c = cVar42;
                          bStack_26d = bVar41;
                          cStack_26e = cVar40;
                          cStack_26f = cVar39;
                          cStack_270 = cVar38;
                          bStack_271 = bVar37;
                          cStack_272 = cVar36;
                          cStack_273 = cVar35;
                          cStack_274 = cVar34;
                          bStack_275 = bVar33;
                          cStack_276 = cVar32;
                          cStack_277 = cVar31;
                          local_278 = cVar30;
                          local_298 = uVar19;
                          iVar7 = 0;
                          if (uVar15 != 0) {
                            for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                            }
                          }
                          bVar13 = std::
                                   equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   ::operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                                 *)(local_1b8 + 0x48),&local_288,
                                                (basic_string_view<char,_std::char_traits<char>_> *)
                                                ((long)pbVar9 + uVar20 * 0xf0 +
                                                (ulong)(uint)(iVar7 << 4)));
                          if (bVar13) goto LAB_002f2285;
                          uVar15 = uVar15 - 1 & uVar15;
                          uVar19 = local_298;
                          cVar30 = local_278;
                          cVar31 = cStack_277;
                          cVar32 = cStack_276;
                          bVar33 = bStack_275;
                          cVar34 = cStack_274;
                          cVar35 = cStack_273;
                          cVar36 = cStack_272;
                          bVar37 = bStack_271;
                          cVar38 = cStack_270;
                          cVar39 = cStack_26f;
                          cVar40 = cStack_26e;
                          bVar41 = bStack_26d;
                          cVar42 = cStack_26c;
                          cVar43 = cStack_26b;
                          cVar44 = cStack_26a;
                          bVar45 = bStack_269;
                        } while (uVar15 != 0);
                        bVar14 = *(byte *)((long)pgVar8 + uVar20 * 0x10 + 0xf);
                      }
                      if (((&boost::unordered::detail::foa::
                             group15<boost::unordered::detail::foa::plain_integral>::
                             is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar14) ==
                          0) break;
                      lVar21 = uVar20 + uVar19;
                      uVar19 = uVar19 + 1;
                      uVar20 = lVar21 + 1U & local_170.arrays.groups_size_mask;
                    } while (uVar19 <= local_170.arrays.groups_size_mask);
                    local_250 = syntax;
                    uVar18 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                             operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                         *)(local_d8 + 0x68),&local_288);
                    uVar23 = uVar18 >> ((byte)local_70.arrays.groups_size_index & 0x3f);
                    lVar21 = (uVar18 & 0xff) * 4;
                    cVar30 = (&UNK_0042856c)[lVar21];
                    cVar31 = (&UNK_0042856d)[lVar21];
                    cVar32 = (&UNK_0042856e)[lVar21];
                    bVar33 = (&UNK_0042856f)[lVar21];
                    uVar20 = 0;
                    uVar19 = uVar23;
                    cVar34 = cVar30;
                    cVar35 = cVar31;
                    cVar36 = cVar32;
                    bVar37 = bVar33;
                    cVar38 = cVar30;
                    cVar39 = cVar31;
                    cVar40 = cVar32;
                    bVar41 = bVar33;
                    cVar42 = cVar30;
                    cVar43 = cVar31;
                    cVar44 = cVar32;
                    bVar45 = bVar33;
                    do {
                      ppVar11 = local_70.arrays.elements_;
                      pgVar10 = local_70.arrays.groups_;
                      pcVar1 = (char *)((long)local_70.arrays.groups_ + uVar19 * 0x10);
                      local_108 = *pcVar1;
                      cStack_107 = pcVar1[1];
                      cStack_106 = pcVar1[2];
                      bStack_105 = pcVar1[3];
                      cStack_104 = pcVar1[4];
                      cStack_103 = pcVar1[5];
                      cStack_102 = pcVar1[6];
                      bStack_101 = pcVar1[7];
                      cStack_100 = pcVar1[8];
                      cStack_ff = pcVar1[9];
                      cStack_fe = pcVar1[10];
                      bStack_fd = pcVar1[0xb];
                      cStack_fc = pcVar1[0xc];
                      cStack_fb = pcVar1[0xd];
                      cStack_fa = pcVar1[0xe];
                      bVar14 = pcVar1[0xf];
                      auVar29[0] = -(local_108 == cVar30);
                      auVar29[1] = -(cStack_107 == cVar31);
                      auVar29[2] = -(cStack_106 == cVar32);
                      auVar29[3] = -(bStack_105 == bVar33);
                      auVar29[4] = -(cStack_104 == cVar34);
                      auVar29[5] = -(cStack_103 == cVar35);
                      auVar29[6] = -(cStack_102 == cVar36);
                      auVar29[7] = -(bStack_101 == bVar37);
                      auVar29[8] = -(cStack_100 == cVar38);
                      auVar29[9] = -(cStack_ff == cVar39);
                      auVar29[10] = -(cStack_fe == cVar40);
                      auVar29[0xb] = -(bStack_fd == bVar41);
                      auVar29[0xc] = -(cStack_fc == cVar42);
                      auVar29[0xd] = -(cStack_fb == cVar43);
                      auVar29[0xe] = -(cStack_fa == cVar44);
                      auVar29[0xf] = -(bVar14 == bVar45);
                      uVar15 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                              (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                              (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                              (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                              (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                              (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                              (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                              (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                              (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                              (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                              (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                              (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                              (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                              (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                             (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
                      uVar12 = uVar19;
                      bStack_f9 = bVar14;
                      if (uVar15 != 0) {
                        do {
                          local_260 = uVar12;
                          bStack_269 = bVar45;
                          cStack_26a = cVar44;
                          cStack_26b = cVar43;
                          cStack_26c = cVar42;
                          bStack_26d = bVar41;
                          cStack_26e = cVar40;
                          cStack_26f = cVar39;
                          cStack_270 = cVar38;
                          bStack_271 = bVar37;
                          cStack_272 = cVar36;
                          cStack_273 = cVar35;
                          cStack_274 = cVar34;
                          bStack_275 = bVar33;
                          cStack_276 = cVar32;
                          cStack_277 = cVar31;
                          local_278 = cVar30;
                          local_298 = uVar20;
                          uVar6 = 0;
                          if (uVar15 != 0) {
                            for (; (uVar15 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                            }
                          }
                          bVar13 = std::
                                   equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   ::operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                                 *)(local_d8 + 0x68),&local_288,
                                                (basic_string_view<char,_std::char_traits<char>_> *)
                                                ((long)ppVar11 +
                                                (uVar19 * 0xf + (ulong)uVar6) * 0x18));
                          if (bVar13) goto LAB_002f2507;
                          uVar15 = uVar15 - 1 & uVar15;
                          uVar20 = local_298;
                          cVar30 = local_278;
                          cVar31 = cStack_277;
                          cVar32 = cStack_276;
                          bVar33 = bStack_275;
                          cVar34 = cStack_274;
                          cVar35 = cStack_273;
                          cVar36 = cStack_272;
                          bVar37 = bStack_271;
                          cVar38 = cStack_270;
                          cVar39 = cStack_26f;
                          cVar40 = cStack_26e;
                          bVar41 = bStack_26d;
                          cVar42 = cStack_26c;
                          cVar43 = cStack_26b;
                          cVar44 = cStack_26a;
                          bVar45 = bStack_269;
                          uVar12 = local_260;
                        } while (uVar15 != 0);
                        bVar14 = *(byte *)((long)pgVar10 + uVar19 * 0x10 + 0xf);
                        uVar19 = local_260;
                      }
                      if (((&boost::unordered::detail::foa::
                             group15<boost::unordered::detail::foa::plain_integral>::
                             is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bVar14) ==
                          0) break;
                      lVar21 = uVar19 + uVar20;
                      uVar20 = uVar20 + 1;
                      uVar19 = lVar21 + 1U & local_70.arrays.groups_size_mask;
                    } while (uVar20 <= local_70.arrays.groups_size_mask);
                    if (local_70.size_ctrl.size < local_70.size_ctrl.ml) {
                      boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                      ::
                      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::ModportSubroutinePortSyntax*>
                                (&local_210,
                                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                  *)(local_d8 + 0x68),uVar23,uVar18,&local_299,&local_288,&local_250
                                );
                    }
                    else {
                      boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                      ::
                      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::ModportSubroutinePortSyntax*>
                                (&local_210,
                                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                  *)(local_d8 + 0x68),uVar18,&local_299,&local_288,&local_250);
                    }
                  }
                }
              }
LAB_002f2507:
            }
          }
        }
      }
    }
    ppSVar22 = ppSVar22 + 1;
  } while( true );
}

Assistant:

void Scope::handleExportedMethods(std::span<Symbol* const> deferredMembers) const {
    SmallSet<std::string_view, 4> waitingForImport;
    SmallMap<std::string_view, const ModportSubroutinePortSyntax*, 4> foundImports;

    auto create = [&](const ModportSubroutinePortSyntax& syntax) {
        auto& symbol = MethodPrototypeSymbol::implicitExtern(*this, syntax);
        insertMember(&symbol, nullptr, true, true);
    };

    for (auto symbol : deferredMembers) {
        auto& node = symbol->as<DeferredMemberSymbol>().node;
        if (node.kind != SyntaxKind::ModportDeclaration)
            continue;

        for (auto item : node.as<ModportDeclarationSyntax>().items) {
            for (auto port : item->ports->ports) {
                if (port->kind != SyntaxKind::ModportSubroutinePortList)
                    continue;

                auto& portList = port->as<ModportSubroutinePortListSyntax>();
                bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;

                for (auto subPort : portList.ports) {
                    switch (subPort->kind) {
                        case SyntaxKind::ModportNamedPort: {
                            // A simple named export is not enough to create a
                            // new extern prototype, but if an import has already
                            // declared it for us then we can take details from that.
                            // Otherwise remember it in case we see an import for it later.
                            if (isExport) {
                                auto& mnps = subPort->as<ModportNamedPortSyntax>();
                                auto name = mnps.name.valueText();
                                if (name.empty() || nameMap->find(name) != nameMap->end())
                                    break;

                                if (auto it = foundImports.find(name); it != foundImports.end())
                                    create(*it->second);
                                else
                                    waitingForImport.emplace(name);
                            }
                            break;
                        }
                        case SyntaxKind::ModportSubroutinePort: {
                            // If this is an export, see if this should create an implicit
                            // extern prototype. If it's an import then see if a previous
                            // export is waiting for it to be declared.
                            auto& msps = subPort->as<ModportSubroutinePortSyntax>();
                            auto name = msps.prototype->name->getLastToken().valueText();
                            if (name.empty() || nameMap->find(name) != nameMap->end())
                                break;

                            if (isExport) {
                                create(msps);
                            }
                            else {
                                if (waitingForImport.find(name) != waitingForImport.end())
                                    create(msps);
                                else
                                    foundImports.emplace(name, &msps);
                            }
                            break;
                        }
                        default:
                            SLANG_UNREACHABLE;
                    }
                }
            }
        }
    }
}